

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
cmGlobalGenerator::GetGeneratorTarget(cmGlobalGenerator *this,cmTarget *t)

{
  cmake *this_00;
  const_iterator cVar1;
  cmGeneratorTarget *pcVar2;
  allocator local_79;
  Snapshot local_78;
  string local_60;
  cmTarget *t_local;
  cmListFileBacktrace local_38;
  
  t_local = t;
  cVar1 = std::
          _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
          ::find(&(this->GeneratorTargets)._M_t,&t_local);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->GeneratorTargets)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = this->CMakeInstance;
    std::__cxx11::string::string
              ((string *)&local_60,"Missing cmGeneratorTarget instance!",&local_79);
    cmState::Snapshot::Snapshot(&local_78,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_38.Snapshot.Position.Position = local_78.Position.Position;
    local_38.Snapshot.State = local_78.State;
    local_38.Snapshot.Position.Tree = local_78.Position.Tree;
    local_38.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_60,&local_38);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              (&local_38.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
    std::__cxx11::string::~string((string *)&local_60);
    pcVar2 = (cmGeneratorTarget *)0x0;
  }
  else {
    pcVar2 = (cmGeneratorTarget *)cVar1._M_node[1]._M_parent;
  }
  return pcVar2;
}

Assistant:

cmGeneratorTarget*
cmGlobalGenerator::GetGeneratorTarget(cmTarget const* t) const
{
  cmGeneratorTargetsType::const_iterator ti = this->GeneratorTargets.find(t);
  if(ti == this->GeneratorTargets.end())
    {
    this->CMakeInstance->IssueMessage(
      cmake::INTERNAL_ERROR, "Missing cmGeneratorTarget instance!");
    return 0;
    }
  return ti->second;
}